

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Basic.cpp
# Opt level: O1

void __thiscall ObserverManager_SharedPtr_Test::TestBody(ObserverManager_SharedPtr_Test *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  bool bVar1;
  char *message;
  shared_ptr<B> b;
  AssertionResult gtest_ar;
  shared_ptr<A> a;
  stringstream out;
  AssertHelper local_1f0;
  B *local_1e8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  internal local_1b8 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1b0;
  A *local_1a8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1a0;
  stringstream local_198 [128];
  ios_base local_118 [264];
  
  std::__cxx11::stringstream::stringstream(local_198);
  local_1a8 = (A *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<A,std::allocator<A>,std::__cxx11::stringstream&,char_const(&)[4]>
            (&local_1a0,&local_1a8,(allocator<A> *)&local_1d8,
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198,
             (char (*) [4])"Tic");
  ObserverManager::subscribe<FooBarProtocol,A>(local_1a8);
  local_1e8 = (B *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<B,std::allocator<B>,std::__cxx11::stringstream&>
            (&local_1e0,&local_1e8,(allocator<B> *)&local_1d8,
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198);
  ObserverManager::subscribe<FooBarProtocol,B>(local_1e8);
  ObserverManager::notify<FooBarProtocol>((ObserverManager *)0x11,0);
  this_00._M_pi = local_1e0._M_pi;
  if (local_1e0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_1e0._M_pi)->_M_use_count = (local_1e0._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_1e0._M_pi)->_M_use_count = (local_1e0._M_pi)->_M_use_count + 1;
    }
  }
  ObserverManager::unsubscribe<FooBarProtocol>(&local_1e8->super_FooBarProtocol);
  if (this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00._M_pi);
  }
  ObserverManager::notify<FooBarProtocol,std::__cxx11::string_const&,char_const*>
            ((ObserverManager *)0x19,0,"Tac");
  std::__cxx11::stringbuf::str();
  testing::internal::CmpHelperEQ<char[9],std::__cxx11::string>
            (local_1b8,"\"Tic Tac \"","out.str()",(char (*) [9])0x14b0e6,&local_1d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p);
  }
  if (local_1b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_1d8);
    if (local_1b0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      message = "";
    }
    else {
      message = ((local_1b0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/fnz[P]ObserverManager/Tests/Basic.cpp"
               ,0xb0,message);
    testing::internal::AssertHelper::operator=(&local_1f0,(Message *)&local_1d8);
    testing::internal::AssertHelper::~AssertHelper(&local_1f0);
    if ((long *)local_1d8._M_dataplus._M_p != (long *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)local_1d8._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_1d8._M_dataplus._M_p + 8))();
      }
      local_1d8._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_1b0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_1e0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1e0._M_pi);
  }
  if (local_1a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1a0._M_pi);
  }
  std::__cxx11::stringstream::~stringstream(local_198);
  std::ios_base::~ios_base(local_118);
  return;
}

Assistant:

TEST(ObserverManager, SharedPtr)  {
    std::stringstream out;

    auto a = std::make_shared<A>(out, "Tic");
    ObserverManager::subscribe<FooBarProtocol>(a);

    auto b = std::make_shared<B>(out);
    ObserverManager::subscribe<FooBarProtocol>(b);
    
    ObserverManager::notify(&FooBarProtocol::foo);

    ObserverManager::unsubscribe<FooBarProtocol>(b);

    ObserverManager::notify(&FooBarProtocol::bar, "Tac");
    
    EXPECT_EQ("Tic Tac ", out.str());
}